

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

set<uint256,_std::less<uint256>,_std::allocator<uint256>_> * __thiscall
wallet::CWallet::GetConflicts
          (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__return_storage_ptr__,
          CWallet *this,uint256 *txid)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  key_type *pkVar3;
  const_iterator cVar4;
  size_type sVar5;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var6;
  const_iterator _it;
  key_type *__k;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,txid);
  if (cVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    __k = (key_type *)
          **(long **)((long)cVar4.
                            super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                            ._M_cur + 0x1c0);
    pkVar3 = (key_type *)
             (*(long **)((long)cVar4.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur + 0x1c0))[1];
    if (__k != pkVar3) {
      do {
        sVar5 = std::
                _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                ::count(&(this->mapTxSpends)._M_h,__k);
        if (1 < sVar5) {
          pVar7 = std::
                  _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  ::equal_range(&(this->mapTxSpends)._M_h,__k);
          for (_Var6._M_cur = (__node_type *)
                              pVar7.first.
                              super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                              _M_cur;
              (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var6._M_cur !=
              pVar7.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
              _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
              _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
            std::
            _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
            ::_M_insert_unique<uint256_const&>
                      ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                        *)__return_storage_ptr__,
                       (uint256 *)
                       ((long)&((_Var6._M_cur)->
                               super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                               super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                               _M_storage._M_storage + 0x24));
          }
        }
        __k = (key_type *)&__k[2].n;
      } while (__k != pkVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint256> CWallet::GetConflicts(const uint256& txid) const
{
    std::set<uint256> result;
    AssertLockHeld(cs_wallet);

    const auto it = mapWallet.find(txid);
    if (it == mapWallet.end())
        return result;
    const CWalletTx& wtx = it->second;

    std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range;

    for (const CTxIn& txin : wtx.tx->vin)
    {
        if (mapTxSpends.count(txin.prevout) <= 1)
            continue;  // No conflict if zero or one spends
        range = mapTxSpends.equal_range(txin.prevout);
        for (TxSpends::const_iterator _it = range.first; _it != range.second; ++_it)
            result.insert(_it->second);
    }
    return result;
}